

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DGXMLScanner::scanStartTagNS(DGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  XMLBuffer *pXVar1;
  ElemStack *this_01;
  short *psVar2;
  short *psVar3;
  XMLCh XVar4;
  XMLCh *pXVar5;
  Grammar *pGVar6;
  NameIdPool<xercesc_4_0::DTDElementDecl> *pNVar7;
  XMLValidator *pXVar8;
  XMLReader *this_02;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *this_03;
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *this_04;
  XMLDocumentHandler *pXVar9;
  int iVar10;
  bool bVar11;
  XMLCh XVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  ulong uVar16;
  DTDElementDecl *this_05;
  XMLSize_t XVar17;
  XMLCh *pXVar18;
  DTDAttDef *attDef;
  XMLAttr *this_06;
  XMLCh *pXVar19;
  XMLCh *pXVar20;
  long lVar21;
  RefHashTableBucketElem<unsigned_int> *pRVar22;
  uint *puVar23;
  XMLSize_t XVar24;
  undefined4 extraout_var_00;
  UnexpectedEOFException *this_07;
  XMLCh *pXVar25;
  RefHashTableBucketElem<unsigned_int> *pRVar26;
  XMLCh *attrLocalName;
  AttTypes AVar27;
  RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *pRVar28;
  XMLSize_t local_90;
  int colonPosition;
  XMLSize_t local_68;
  ulong local_60;
  bool *local_58;
  ElemStack *local_50;
  XMLSize_t local_48;
  XMLBuffer *local_40;
  XMLSize_t failure;
  DTDElementDecl *pDVar15;
  
  *gotData = true;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  pXVar1 = &(this->super_XMLScanner).fQNameBuf;
  (this->super_XMLScanner).fQNameBuf.fIndex = 0;
  bVar11 = XMLReader::getQName((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar1,&colonPosition)
  ;
  if (!bVar11) {
    XVar17 = pXVar1->fIndex;
    if (XVar17 == 0) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    }
    else {
      pXVar5 = (this->super_XMLScanner).fQNameBuf.fBuffer;
      pXVar5[XVar17] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidElementName,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar12 = ReaderMgr::getNextChar(this_00);
      if (XVar12 == L'\0') {
        return false;
      }
    } while (XVar12 != L'<');
    return false;
  }
  local_68 = (this->super_XMLScanner).fElemStack.fStackTop;
  pXVar5 = (this->super_XMLScanner).fQNameBuf.fBuffer;
  pXVar5[(this->super_XMLScanner).fQNameBuf.fIndex] = L'\0';
  pGVar6 = (this->super_XMLScanner).fGrammar;
  iVar13 = (*(pGVar6->super_XSerializable)._vptr_XSerializable[0xb])
                     (pGVar6,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0);
  pDVar15 = (DTDElementDecl *)CONCAT44(extraout_var,iVar13);
  if (pDVar15 == (DTDElementDecl *)0x0) {
    pNVar7 = this->fDTDElemNonDeclPool;
    if (pNVar7->fIdCounter != 0) {
      if ((pXVar5 == (XMLCh *)0x0) || (uVar16 = (ulong)(ushort)*pXVar5, uVar16 == 0)) {
        uVar16 = 0;
      }
      else {
        XVar12 = pXVar5[1];
        if (XVar12 != L'\0') {
          pXVar18 = pXVar5 + 2;
          do {
            uVar16 = (ulong)(ushort)XVar12 + (uVar16 >> 0x18) + uVar16 * 0x26;
            XVar12 = *pXVar18;
            pXVar18 = pXVar18 + 1;
          } while (XVar12 != L'\0');
        }
        uVar16 = uVar16 % (pNVar7->fBucketList).fHashModulus;
      }
      pRVar28 = (pNVar7->fBucketList).fBucketList[uVar16];
      if (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        do {
          bVar11 = StringHasher::equals
                             ((StringHasher *)&(pNVar7->fBucketList).field_0x30,pXVar5,pRVar28->fKey
                             );
          if (bVar11) goto LAB_0029df49;
          pRVar28 = pRVar28->fNext;
        } while (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0);
      }
      pRVar28 = (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0;
LAB_0029df49:
      if (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::DTDElementDecl> *)0x0) {
        pDVar15 = pRVar28->fData;
        goto LAB_0029df55;
      }
    }
    pDVar15 = (DTDElementDecl *)0x0;
  }
LAB_0029df55:
  this_05 = pDVar15;
  if (pDVar15 == (DTDElementDecl *)0x0) {
    this_05 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (this_05,pXVar5,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    XVar17 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,this_05);
    (this_05->super_XMLElementDecl).fId = XVar17;
  }
  this_01 = &(this->super_XMLScanner).fElemStack;
  if ((this->super_XMLScanner).fValidate == true) {
    if (pDVar15 == (DTDElementDecl *)0x0) {
      (this_05->super_XMLElementDecl).fCreateReason = JustFaultIn;
LAB_0029dfc7:
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,ElementNotDefined,pXVar5,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    else if ((this_05->super_XMLElementDecl).fCreateReason != Declared) goto LAB_0029dfc7;
    pXVar8 = (this->super_XMLScanner).fValidator;
    (*pXVar8->_vptr_XMLValidator[9])(pXVar8,this_05);
  }
  ElemStack::addLevel(this_01,&this_05->super_XMLElementDecl,
                      ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum);
  if (local_68 == 0) {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((this->super_XMLScanner).fValidate == true) &&
       (pXVar18 = (this->super_XMLScanner).fRootElemName,
       pXVar5 != pXVar18 && pXVar18 != (XMLCh *)0x0)) {
      pXVar25 = pXVar5;
      if (pXVar5 == (XMLCh *)0x0) {
LAB_0029e081:
        if (*pXVar18 == L'\0') goto LAB_0029e098;
      }
      else {
        do {
          XVar12 = *pXVar25;
          if (XVar12 == L'\0') goto LAB_0029e081;
          pXVar25 = pXVar25 + 1;
          XVar4 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar12 == XVar4);
      }
      XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
    }
  }
  else if ((this->super_XMLScanner).fValidate == true) {
    ElemStack::addChild(this_01,(this_05->super_XMLElementDecl).fElementName,true);
  }
LAB_0029e098:
  local_58 = gotData;
  local_50 = this_01;
  ReaderMgr::skipPastSpaces(this_00);
  local_48 = (((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).
             fCurCount;
  this->fElemCount = this->fElemCount + 1;
  pXVar1 = &(this->super_XMLScanner).fAttNameBuf;
  local_40 = &(this->super_XMLScanner).fAttValueBuf;
  local_90 = 0;
  uVar16 = 0;
  do {
    XVar12 = ReaderMgr::peekNextChar(this_00);
    if (((local_90 != 0) && (XVar12 != L'/')) && (XVar12 != L'>')) {
      if ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)XVar12] <
          '\0') {
        ReaderMgr::skipPastSpaces(this_00);
        XVar12 = ReaderMgr::peekNextChar(this_00);
      }
      else {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
      }
    }
    this_02 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    if ((this_02->fgCharCharsTable[(ushort)XVar12] & 0x10) == 0) {
      pXVar1->fIndex = 0;
      bVar11 = XMLReader::getQName(this_02,pXVar1,&colonPosition);
      if (bVar11) {
        bVar11 = XMLScanner::scanEq(&this->super_XMLScanner,false);
        if (!bVar11) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
          XVar12 = ReaderMgr::skipUntilInOrWS(this_00,L"\'\"></");
          if ((ushort)XVar12 < 0x2f) {
            if ((XVar12 != L'\"') && (XVar12 != L'\'')) {
LAB_0029e330:
              if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                             [(ushort)XVar12]) {
                iVar13 = 1;
                if (XVar12 == L'<') {
                  pXVar18 = QName::getRawName((this_05->super_XMLElementDecl).fElementName);
                  XMLScanner::emitError
                            (&this->super_XMLScanner,UnterminatedStartTag,pXVar18,(XMLCh *)0x0,
                             (XMLCh *)0x0,(XMLCh *)0x0);
                  bVar11 = false;
                }
                else {
                  bVar11 = false;
                }
                goto LAB_0029e37c;
              }
            }
            iVar13 = 0;
            bVar11 = true;
          }
          else {
            iVar13 = 2;
            bVar11 = false;
            if ((XVar12 != L'/') && (bVar11 = false, XVar12 != L'>')) goto LAB_0029e330;
          }
LAB_0029e37c:
          if (!bVar11) goto LAB_0029e741;
        }
        pXVar18 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
        pXVar18[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
        local_60 = uVar16;
        attDef = DTDElementDecl::getAttDef(this_05,pXVar18);
        ReaderMgr::skipPastSpaces(this_00);
        bVar11 = scanAttValue(this,&attDef->super_XMLAttDef,pXVar18,local_40);
        if (!bVar11) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
          XVar12 = ReaderMgr::skipUntilInOrWS(this_00,L"></");
          if (((XVar12 != L'/') && (XVar12 != L'>')) &&
             (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                         [(ushort)XVar12])) {
            iVar13 = 1;
            uVar16 = local_60;
            iVar10 = 1;
            if (XVar12 == L'<') goto LAB_0029e2b7;
            goto LAB_0029e741;
          }
        }
        pXVar25 = (this->super_XMLScanner).fAttValueBuf.fBuffer;
        pXVar25[(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
        if (local_90 < local_48) {
          this_06 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                              (&((this->super_XMLScanner).fAttrList)->
                                super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,local_90);
        }
        else {
          this_06 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
          XMLAttr::XMLAttr(this_06,(this->super_XMLScanner).fMemoryManager);
          this_03 = &((this->super_XMLScanner).fAttrList)->
                     super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
          BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(this_03,1);
          XVar17 = this_03->fCurCount;
          this_03->fElemList[XVar17] = this_06;
          this_03->fCurCount = XVar17 + 1;
        }
        this_06->fSpecified = true;
        if (attDef == (DTDAttDef *)0x0) {
          AVar27 = AttTypes_Min;
        }
        else {
          AVar27 = (attDef->super_XMLAttDef).fType;
        }
        QName::setName(this_06->fAttName,pXVar18,(this->super_XMLScanner).fEmptyNamespaceId);
        XMLAttr::setValue(this_06,L"");
        this_06->fType = AVar27;
        pXVar18 = this_06->fAttName->fPrefix;
        attrLocalName = this_06->fAttName->fLocalPart;
        if ((pXVar18 == (XMLCh *)0x0) || (*pXVar18 == L'\0')) {
          if (attrLocalName == L"xmlns") {
LAB_0029e5ca:
            attrLocalName = L"";
LAB_0029e626:
            updateNSMap(this,pXVar18,attrLocalName,pXVar25);
          }
          else {
            pXVar19 = L"xmlns";
            if (attrLocalName == (XMLCh *)0x0) {
LAB_0029e5c4:
              if (*pXVar19 == L'\0') goto LAB_0029e5ca;
            }
            else {
              pXVar20 = L"xmlns";
              pXVar19 = attrLocalName;
              do {
                XVar12 = *pXVar20;
                if (XVar12 == L'\0') goto LAB_0029e5c4;
                pXVar20 = pXVar20 + 1;
                XVar4 = *pXVar19;
                pXVar19 = pXVar19 + 1;
              } while (XVar12 == XVar4);
            }
          }
        }
        else if (pXVar18 == L"xml") {
LAB_0029e5b3:
          XMLAttr::setURIId(this_06,(this->super_XMLScanner).fXMLNamespaceId);
        }
        else {
          lVar21 = 0;
          do {
            psVar3 = (short *)((long)pXVar18 + lVar21);
            if (*psVar3 == 0) {
              if (*(short *)((long)&XMLUni::fgXMLString + lVar21) == 0) goto LAB_0029e5b3;
              break;
            }
            psVar2 = (short *)((long)&XMLUni::fgXMLString + lVar21);
            lVar21 = lVar21 + 2;
          } while (*psVar3 == *psVar2);
          if (pXVar18 == L"xmlns") {
LAB_0029e611:
            XMLAttr::setURIId(this_06,(this->super_XMLScanner).fXMLNSNamespaceId);
            goto LAB_0029e626;
          }
          lVar21 = 0;
          do {
            psVar3 = (short *)((long)pXVar18 + lVar21);
            if (*psVar3 == 0) {
              if (*(short *)((long)&XMLUni::fgXMLNSString + lVar21) == 0) goto LAB_0029e611;
              break;
            }
            psVar2 = (short *)((long)&XMLUni::fgXMLNSString + lVar21);
            lVar21 = lVar21 + 2;
          } while (*psVar3 == *psVar2);
          this_04 = this->fAttrNSList;
          ValueVectorOf<xercesc_4_0::XMLAttr_*>::ensureExtraCapacity(this_04,1);
          XVar17 = this_04->fCurCount;
          this_04->fCurCount = XVar17 + 1;
          this_04->fElemList[XVar17] = this_06;
        }
        uVar16 = local_60;
        if (attDef != (DTDAttDef *)0x0) {
          pRVar22 = this->fAttDefRegistry->fBucketList
                    [(ulong)attDef % this->fAttDefRegistry->fHashModulus];
          pRVar26 = (RefHashTableBucketElem<unsigned_int> *)0x0;
          if (pRVar22 != (RefHashTableBucketElem<unsigned_int> *)0x0) {
            do {
              pRVar26 = pRVar22;
              if ((DTDAttDef *)pRVar22->fKey == attDef) goto LAB_0029e677;
              pRVar22 = pRVar22->fNext;
            } while (pRVar22 != (RefHashTableBucketElem<unsigned_int> *)0x0);
            pRVar26 = (RefHashTableBucketElem<unsigned_int> *)0x0;
          }
LAB_0029e677:
          if (pRVar26 == (RefHashTableBucketElem<unsigned_int> *)0x0) {
            puVar23 = (uint *)0x0;
          }
          else {
            puVar23 = pRVar26->fData;
          }
          if (puVar23 == (uint *)0x0) {
            puVar23 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
            *puVar23 = this->fElemCount;
            RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                      (this->fAttDefRegistry,attDef,puVar23);
          }
          else if (*puVar23 < this->fElemCount) {
            *puVar23 = this->fElemCount;
          }
        }
        if ((this->super_XMLScanner).fValidate == true) {
          if (attDef == (DTDAttDef *)0x0) {
            pXVar18 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
            pXVar8 = (this->super_XMLScanner).fValidator;
            pXVar18[(this->super_XMLScanner).fAttNameBuf.fIndex] = L'\0';
            XMLValidator::emitError
                      (pXVar8,AttNotDefinedForElement,pXVar18,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          else {
            pXVar8 = (this->super_XMLScanner).fValidator;
            (this->super_XMLScanner).fAttValueBuf.fBuffer
            [(this->super_XMLScanner).fAttValueBuf.fIndex] = L'\0';
            (*pXVar8->_vptr_XMLValidator[8])(pXVar8,attDef);
          }
        }
        XMLAttr::setValue(this_06,pXVar25);
        local_90 = local_90 + 1;
        iVar13 = 2;
      }
      else {
        if (pXVar1->fIndex == 0) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        }
        else {
          pXVar18 = (this->super_XMLScanner).fAttNameBuf.fBuffer;
          pXVar18[pXVar1->fIndex] = L'\0';
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidAttrName,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        do {
          XVar12 = ReaderMgr::getNextChar(this_00);
          if (XVar12 == L'\0') break;
        } while (XVar12 != L'>');
        iVar13 = 1;
      }
    }
    else {
      iVar13 = 0;
      if ((ushort)XVar12 < 0x2f) {
        if ((XVar12 == L'\"') || (XVar12 == L'\'')) {
          XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
          ReaderMgr::getNextChar(this_00);
          ReaderMgr::skipQuotedString(this_00,XVar12);
          ReaderMgr::skipPastSpaces(this_00);
          iVar13 = 2;
        }
        else if (XVar12 == L'\0') {
          this_07 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_07,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                     ,0x745,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(this_07,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
        }
      }
      else if (XVar12 == L'/') {
        ReaderMgr::getNextChar(this_00);
        bVar11 = ReaderMgr::skippedChar(this_00,L'>');
        iVar13 = 3;
        uVar16 = CONCAT71((int7)(uVar16 >> 8),1);
        iVar10 = 3;
        if (!bVar11) {
LAB_0029e2b7:
          iVar13 = iVar10;
          pXVar18 = QName::getRawName((this_05->super_XMLElementDecl).fElementName);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
      }
      else {
        if (XVar12 == L'<') {
          pXVar18 = QName::getRawName((this_05->super_XMLElementDecl).fElementName);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar18,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        else {
          if (XVar12 != L'>') goto LAB_0029e741;
          ReaderMgr::getNextChar(this_00);
        }
        iVar13 = 3;
      }
    }
LAB_0029e741:
    if ((iVar13 != 0) && (iVar13 != 2)) {
      if (iVar13 != 3) {
        return false;
      }
      if (local_90 != 0) {
        scanAttrListforNameSpaces
                  (this,(this->super_XMLScanner).fAttrList,local_90,&this_05->super_XMLElementDecl);
        Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
      }
      XVar24 = buildAttList(this,local_90,&this_05->super_XMLElementDecl,
                            (this->super_XMLScanner).fAttrList);
      XVar17 = local_68;
      if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
        bVar11 = local_68 == 0;
        uVar14 = XMLScanner::resolvePrefix
                           (&this->super_XMLScanner,
                            ((this_05->super_XMLElementDecl).fElementName)->fPrefix,Mode_Element);
        pXVar9 = (this->super_XMLScanner).fDocHandler;
        (*pXVar9->_vptr_XMLDocumentHandler[0xb])
                  (pXVar9,this_05,(ulong)uVar14,
                   ((this_05->super_XMLElementDecl).fElementName)->fPrefix,
                   (this->super_XMLScanner).fAttrList,XVar24,(ulong)((uint)uVar16 & 1),(ulong)bVar11
                  );
      }
      if ((uVar16 & 1) != 0) {
        if (((this->super_XMLScanner).fValidate == true) &&
           (pXVar8 = (this->super_XMLScanner).fValidator,
           iVar13 = (*pXVar8->_vptr_XMLValidator[2])(pXVar8,this_05,0,0), (char)iVar13 == '\0')) {
          pXVar8 = (this->super_XMLScanner).fValidator;
          iVar13 = (*(this_05->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                             (this_05);
          XMLValidator::emitError
                    (pXVar8,ElementNotValidForContent,pXVar5,
                     (XMLCh *)CONCAT44(extraout_var_00,iVar13),(XMLCh *)0x0,(XMLCh *)0x0);
        }
        ElemStack::popTop(local_50);
        if (XVar17 == 0) {
          *local_58 = false;
          return true;
        }
        return true;
      }
      return true;
    }
  } while( true );
}

Assistant:

bool DGXMLScanner::scanStartTagNS(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.

    int  colonPosition;
    bool validName = fReaderMgr.getQName(fQNameBuf, &colonPosition);
    if (!validName)
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We *do not* tell him to fault in a decl if he does not find one - NG.
    bool wasAdded = false;
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();

    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , qnameRawBuf
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(qnameRawBuf);
    }
    if(!elemDecl)
    {
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            qnameRawBuf
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    if (fValidate) {

        if (wasAdded)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }
        // If its not marked declared, then emit an error
        else if (!elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }


        fValidator->validateElement(elemDecl);
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(qnameRawBuf, fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else if (fValidate)
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    // Ok, skip by them and peek another char
                    fReaderMgr.skipPastSpaces();
                    nextCh = fReaderMgr.peekNextChar();
                }
                 else
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.

            validName = fReaderMgr.getQName(fAttNameBuf, &colonPosition);
            if (!validName)
            {
                if (fAttNameBuf.isEmpty())
                    emitError(XMLErrs::ExpectedAttrName);
                else
                    emitError(XMLErrs::InvalidAttrName, fAttNameBuf.getRawBuffer());
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            const XMLCh* attrValue = fAttValueBuf.getRawBuffer();

            if (attCount >= curAttListSize) {
                curAtt = new (fMemoryManager) XMLAttr(fMemoryManager);
                fAttrList->addElement(curAtt);
            }
            else {
                curAtt = fAttrList->elementAt(attCount);
            }

            curAtt->setSpecified(true);
            // DO NAMESPACES
            {
                curAtt->set(
                    fEmptyNamespaceId, namePtr, XMLUni::fgZeroLenString
                    , (attDef)? attDef->getType() : XMLAttDef::CData
                );

                // each attribute has the prefix:suffix="value"
                const XMLCh* attPrefix = curAtt->getPrefix();
                const XMLCh* attLocalName = curAtt->getName();

                if (attPrefix && *attPrefix) {
                    if (XMLString::equals(attPrefix, XMLUni::fgXMLString)) {
                        curAtt->setURIId(fXMLNamespaceId);
                    }
                    else if (XMLString::equals(attPrefix, XMLUni::fgXMLNSString)) {
                        curAtt->setURIId(fXMLNSNamespaceId);
                        updateNSMap(attPrefix, attLocalName, attrValue);
                    }
                    else {
                        fAttrNSList->addElement(curAtt);
                    }
                }
                else if (XMLString::equals(XMLUni::fgXMLNSString, attLocalName))
                {
                    updateNSMap(attPrefix, XMLUni::fgZeroLenString, attrValue);
                }

                // NOTE: duplicate attribute check will be done, when we map
                //       namespaces to all attributes
                if (attDef) {
                    unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                    if (!curCountPtr) {
                        curCountPtr = getNewUIntPtr();
                        *curCountPtr = fElemCount;
                        fAttDefRegistry->put(attDef, curCountPtr);
                   }
                    else if (*curCountPtr < fElemCount) {
                        *curCountPtr = fElemCount;
                    }
                }
            }

            if (fValidate)
            {
                if (attDef) {
                    // Let the validator pass judgement on the attribute value
                    fValidator->validateAttrValue(
                        attDef, fAttValueBuf.getRawBuffer(), false, elemDecl
                    );
                }
                else
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer(), qnameRawBuf
                    );
                }
            }

            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(attrValue);
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    //  Make an initial pass through the list and find any xmlns attributes.
    if (attCount)
      scanAttrListforNameSpaces(fAttrList, attCount, elemDecl);

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(attCount, elemDecl, *fAttrList);

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        unsigned int uriId = resolvePrefix
            (
                elemDecl->getElementName()->getPrefix()
                , ElemStack::Mode_Element
            );

        fDocHandler->startElement
        (
            *elemDecl
            , uriId
            , elemDecl->getElementName()->getPrefix()
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , qnameRawBuf
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    return true;
}